

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob-test.c++
# Opt level: O2

void __thiscall capnp::anon_unknown_0::TestCase34::run(TestCase34 *this)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  char *__s2;
  Builder builder;
  Reader text;
  char c [4];
  ArrayPtr<char> local_88;
  ArrayPtr<const_char> local_78;
  Reader text2;
  string str;
  Reader text3;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&str,"foo",(allocator<char> *)&builder);
  sVar3 = strlen(str._M_dataplus._M_p);
  text.super_StringPtr.content.size_ = sVar3 + 1;
  text.super_StringPtr.content.ptr = str._M_dataplus._M_p;
  bVar1 = kj::operator==("foo",&text.super_StringPtr);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[35],char_const(&)[4],capnp::Text::Reader&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
               ,0x26,ERROR,"\"failed: expected \" \"(\\\"foo\\\") == (text)\", \"foo\", text",
               (char (*) [35])"failed: expected (\"foo\") == (text)",(char (*) [4])"foo",
               (Reader *)&text.super_StringPtr);
  }
  __s2 = text.super_StringPtr.content.ptr;
  iVar4 = kj::_::Debug::minSeverity;
  iVar2 = strcmp("foo",text.super_StringPtr.content.ptr);
  if (iVar4 < 3 && iVar2 != 0) {
    builder._0_8_ = __s2;
    kj::_::Debug::log<char_const(&)[51],char_const(&)[4],char_const*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
               ,0x27,ERROR,
               "\"failed: expected \" \"::strcmp(\\\"foo\\\", text.cStr()) == 0\", \"foo\", text.cStr()"
               ,(char (*) [51])"failed: expected ::strcmp(\"foo\", text.cStr()) == 0",
               (char (*) [4])"foo",(char **)&builder);
    __s2 = text.super_StringPtr.content.ptr;
    iVar4 = kj::_::Debug::minSeverity;
  }
  iVar2 = strcmp("foo",__s2);
  if (iVar4 < 3 && iVar2 != 0) {
    builder._0_8_ = __s2;
    kj::_::Debug::log<char_const(&)[52],char_const(&)[4],char_const*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
               ,0x28,ERROR,
               "\"failed: expected \" \"::strcmp(\\\"foo\\\", text.begin()) == 0\", \"foo\", text.begin()"
               ,(char (*) [52])"failed: expected ::strcmp(\"foo\", text.begin()) == 0",
               (char (*) [4])"foo",(char **)&builder);
    iVar4 = kj::_::Debug::minSeverity;
  }
  if ((text.super_StringPtr.content.size_ - 1 != 3) && (iVar4 < 3)) {
    text2.super_StringPtr.content.ptr = (char *)CONCAT44(text2.super_StringPtr.content.ptr._4_4_,3);
    builder._0_8_ = text.super_StringPtr.content.size_ - 1;
    kj::_::Debug::log<char_const(&)[39],unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
               ,0x29,ERROR,"\"failed: expected \" \"(3u) == (text.size())\", 3u, text.size()",
               (char (*) [39])"failed: expected (3u) == (text.size())",(uint *)&text2,
               (unsigned_long *)&builder);
  }
  text2.super_StringPtr.content.ptr = "bar";
  text2.super_StringPtr.content.size_ = 4;
  bVar1 = kj::operator==("bar",&text2.super_StringPtr);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[36],char_const(&)[4],capnp::Text::Reader&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
               ,0x2c,ERROR,"\"failed: expected \" \"(\\\"bar\\\") == (text2)\", \"bar\", text2",
               (char (*) [36])"failed: expected (\"bar\") == (text2)",(char (*) [4])0x2c587e,
               (Reader *)&text2.super_StringPtr);
  }
  builtin_strncpy(c,"baz",4);
  sVar3 = strlen(c);
  text3.super_StringPtr.content.size_ = sVar3 + 1;
  text3.super_StringPtr.content.ptr = c;
  bVar1 = kj::operator==("baz",&text3.super_StringPtr);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[36],char_const(&)[4],capnp::Text::Reader&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
               ,0x30,ERROR,"\"failed: expected \" \"(\\\"baz\\\") == (text3)\", \"baz\", text3",
               (char (*) [36])"failed: expected (\"baz\") == (text3)",(char (*) [4])0x2cc7a6,
               (Reader *)&text3.super_StringPtr);
  }
  builder.content.size_ = 4;
  builder.content.ptr = c;
  bVar1 = operator==("baz",&builder);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[38],char_const(&)[4],capnp::Text::Builder&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
               ,0x33,ERROR,"\"failed: expected \" \"(\\\"baz\\\") == (builder)\", \"baz\", builder",
               (char (*) [38])"failed: expected (\"baz\") == (builder)",(char (*) [4])0x2cc7a6,
               &builder);
  }
  local_78.ptr = "az";
  local_78.size_ = 2;
  local_88.ptr = builder.content.ptr + 1;
  local_88.size_ = 2;
  bVar1 = kj::ArrayPtr<char_const>::operator==((ArrayPtr<char_const> *)&local_78,&local_88);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    local_78.ptr = "az";
    local_78.size_ = 2;
    local_88.ptr = builder.content.ptr + 1;
    local_88.size_ = 2;
    kj::_::Debug::log<char_const(&)[66],kj::ArrayPtr<char_const>,kj::ArrayPtr<char>>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
               ,0x35,ERROR,
               "\"failed: expected \" \"(kj::arrayPtr(\\\"az\\\", 2)) == (builder.slice(1, 3))\", kj::arrayPtr(\"az\", 2), builder.slice(1, 3)"
               ,(char (*) [66])"failed: expected (kj::arrayPtr(\"az\", 2)) == (builder.slice(1, 3))"
               ,&local_78,&local_88);
  }
  std::__cxx11::string::~string((string *)&str);
  return;
}

Assistant:

TEST(Blob, Text) {
  std::string str = "foo";
  Text::Reader text = str.c_str();

  EXPECT_EQ("foo", text);
  EXPECT_STREQ("foo", text.cStr());
  EXPECT_STREQ("foo", text.begin());
  EXPECT_EQ(3u, text.size());

  Text::Reader text2 = "bar";
  EXPECT_EQ("bar", text2);

  char c[4] = "baz";
  Text::Reader text3(c);
  EXPECT_EQ("baz", text3);

  Text::Builder builder(c, 3);
  EXPECT_EQ("baz", builder);

  EXPECT_EQ(kj::arrayPtr("az", 2), builder.slice(1, 3));
}